

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::anon_unknown_1::RaiiMessage::writeProperty
          (RaiiMessage *this,char *name,string *value)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  string *local_20;
  string *value_local;
  char *name_local;
  RaiiMessage *this_local;
  
  local_20 = value;
  value_local = (string *)name;
  name_local = (char *)this;
  poVar1 = std::operator<<(this->m_out,' ');
  poVar1 = std::operator<<(poVar1,(char *)value_local);
  poVar1 = std::operator<<(poVar1,"=\'");
  std::__cxx11::string::string((string *)&local_60,(string *)value);
  escape(&local_40,this,&local_60);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,'\'');
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void writeProperty(const char* const name, const std::string value)
    {
        m_out << ' ' << name << "='" << escape(value) << '\'';
    }